

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

void __thiscall
arangodb::velocypack::Validator::validatePart
          (Validator *this,uint8_t *ptr,size_t length,bool isSubPart)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  Exception *this_00;
  size_t sVar5;
  char *msg;
  ExceptionType type;
  Validator *this_01;
  Validator *pVVar6;
  ulong uVar7;
  
  if (length == 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "length 0 is invalid for any VelocyPack value";
LAB_00103421:
    Exception::Exception(this_00,ValidatorInvalidLength,msg);
    goto LAB_0010349c;
  }
  bVar1 = *ptr;
  if (SliceStaticData::TypeMap[bVar1] == None && (ulong)bVar1 != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = ValidatorInvalidType;
    goto LAB_00103497;
  }
  this_01 = this;
  switch(SliceStaticData::TypeMap[bVar1]) {
  case Array:
    uVar4 = this->_nesting + 1;
    this->_nesting = uVar4;
    if (this->options->nestingLimit <= uVar4) {
LAB_0010343d:
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      type = TooDeepNesting;
      break;
    }
    validateArray(this,ptr,length);
    goto LAB_0010325b;
  case Object:
    uVar4 = this->_nesting + 1;
    this->_nesting = uVar4;
    if (this->options->nestingLimit <= uVar4) goto LAB_0010343d;
    validateObject(this,ptr,length);
LAB_0010325b:
    this->_nesting = this->_nesting - 1;
switchD_0010320f_caseD_6:
    validateSliceLength(this_01,ptr,length,isSubPart);
    return;
  default:
    goto switchD_0010320f_caseD_6;
  case External:
    if (this->options->disallowExternals != true) {
      validateBufferLength(this,9,length,true);
      this_01 = this;
      goto switchD_0010320f_caseD_6;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = BuilderExternalsDisallowed;
    break;
  case String:
    if (bVar1 == 0xbf) {
      validateBufferLength(this,9,length,true);
      uVar7 = *(ulong *)(ptr + 1);
      pVVar6 = (Validator *)(ptr + 9);
      sVar5 = uVar7 + 9;
    }
    else {
      uVar7 = (ulong)(bVar1 - 0x40);
      pVVar6 = (Validator *)(ptr + 1);
      sVar5 = uVar7 + 1;
    }
    validateBufferLength(this_01,sVar5,length,true);
    if ((this->options->validateUtf8Strings != true) ||
       (cVar3 = (*(code *)ValidateUtf8String)(pVVar6,uVar7), this_01 = pVVar6, cVar3 != '\0'))
    goto switchD_0010320f_caseD_6;
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = InvalidUtf8Sequence;
    break;
  case BCD:
    bVar2 = this->options->disallowBCD;
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    if (bVar2 == true) {
      type = BuilderBCDDisallowed;
    }
    else {
      type = NotImplemented;
    }
    break;
  case Custom:
    if (this->options->disallowCustom != true) {
      if ((byte)(bVar1 + 0x10) < 4) {
        sVar5 = *(size_t *)(&DAT_0010d7d0 + (ulong)(byte)(bVar1 + 0x10) * 8);
      }
      else if ((byte)(bVar1 + 0xc) < 3) {
        validateBufferLength(this,2,length,true);
        if ((ulong)ptr[1] == 0) {
LAB_001034ba:
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Invalid size for Custom type";
          goto LAB_00103421;
        }
        sVar5 = (ulong)ptr[1] + 2;
      }
      else if ((byte)(bVar1 + 9) < 3) {
        validateBufferLength(this,3,length,true);
        if ((ulong)*(ushort *)(ptr + 1) == 0) goto LAB_001034ba;
        sVar5 = (ulong)*(ushort *)(ptr + 1) + 3;
      }
      else if ((byte)(bVar1 + 6) < 3) {
        validateBufferLength(this,5,length,true);
        if ((ulong)*(uint *)(ptr + 1) == 0) goto LAB_001034ba;
        sVar5 = (ulong)*(uint *)(ptr + 1) + 5;
      }
      else if (bVar1 < 0xfd) {
        sVar5 = 0;
      }
      else {
        validateBufferLength(this,9,length,true);
        if (*(long *)(ptr + 1) == 0) goto LAB_001034ba;
        sVar5 = *(long *)(ptr + 1) + 9;
      }
      validateSliceLength(this,ptr,sVar5,isSubPart);
      this_01 = this;
      goto switchD_0010320f_caseD_6;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = BuilderCustomDisallowed;
    break;
  case Tagged:
    if (this->options->disallowTags != true) {
      validateTagged(this,ptr,length);
      this_01 = this;
      goto switchD_0010320f_caseD_6;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    type = BuilderTagsDisallowed;
  }
LAB_00103497:
  Exception::Exception(this_00,type);
LAB_0010349c:
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validatePart(uint8_t const* ptr, std::size_t length,
                             bool isSubPart) {
  if (length == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "length 0 is invalid for any VelocyPack value");
  }

  uint8_t head = *ptr;

  // type() only reads the first byte, which is safe
  ValueType const type = Slice(ptr).type();

  if (type == ValueType::None && head != 0x00U) {
    // invalid type
    throw Exception(Exception::ValidatorInvalidType);
  }

  // special handling for certain types...
  switch (type) {
    case ValueType::None:
    case ValueType::Null:
    case ValueType::Bool:
    case ValueType::MinKey:
    case ValueType::MaxKey:
    case ValueType::SmallInt:
    case ValueType::Int:
    case ValueType::UInt:
    case ValueType::Double:
    case ValueType::UTCDate:
    case ValueType::Binary:
    case ValueType::Illegal: {
      break;
    }

    case ValueType::String: {
      uint8_t const* p;
      ValueLength len;
      if (head == 0xbfU) {
        // long UTF-8 string. must be at least 9 bytes long so we
        // can read the entire string length safely
        validateBufferLength(1 + 8, length, true);
        len = readIntegerFixed<ValueLength, 8>(ptr + 1);
        p = ptr + 1 + 8;
        validateBufferLength(len + 1 + 8, length, true);
      } else {
        len = head - 0x40U;
        p = ptr + 1;
        validateBufferLength(len + 1, length, true);
      }

      if (options->validateUtf8Strings &&
          !ValidateUtf8String(p, static_cast<std::size_t>(len))) {
        throw Exception(Exception::InvalidUtf8Sequence);
      }
      break;
    }

    case ValueType::Array: {
      if (++_nesting >= options->nestingLimit) {
        throw Exception(Exception::TooDeepNesting);
      }
      validateArray(ptr, length);
      --_nesting;
      break;
    }

    case ValueType::Object: {
      if (++_nesting >= options->nestingLimit) {
        throw Exception(Exception::TooDeepNesting);
      }
      validateObject(ptr, length);
      --_nesting;
      break;
    }

    case ValueType::BCD: {
      if (options->disallowBCD) {
        throw Exception(Exception::BuilderBCDDisallowed);
      }
      throw Exception(Exception::NotImplemented);
    }

    case ValueType::Tagged: {
      if (options->disallowTags) {
        throw Exception(Exception::BuilderTagsDisallowed);
      }
      validateTagged(ptr, length);
      break;
    }

    case ValueType::External: {
      // check if Externals are forbidden
      if (options->disallowExternals) {
        throw Exception(Exception::BuilderExternalsDisallowed);
      }
      // validate if Slice length exceeds the given buffer
      validateBufferLength(1 + sizeof(void*), length, true);
      // do not perform pointer validation
      break;
    }

    case ValueType::Custom: {
      if (options->disallowCustom) {
        throw Exception(Exception::BuilderCustomDisallowed);
      }
      ValueLength byteSize = 0;

      if (head == 0xf0U) {
        byteSize = 1 + 1;
      } else if (head == 0xf1U) {
        byteSize = 1 + 2;
      } else if (head == 0xf2U) {
        byteSize = 1 + 4;
      } else if (head == 0xf3U) {
        byteSize = 1 + 8;
      } else if (head >= 0xf4U && head <= 0xf6U) {
        validateBufferLength(1 + 1, length, true);
        byteSize = 1 + 1 + readIntegerNonEmpty<ValueLength>(ptr + 1, 1);
        if (byteSize == 1 + 1) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xf7U && head <= 0xf9U) {
        validateBufferLength(1 + 2, length, true);
        byteSize = 1 + 2 + readIntegerNonEmpty<ValueLength>(ptr + 1, 2);
        if (byteSize == 1 + 2) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xfaU && head <= 0xfcU) {
        validateBufferLength(1 + 4, length, true);
        byteSize = 1 + 4 + readIntegerNonEmpty<ValueLength>(ptr + 1, 4);
        if (byteSize == 1 + 4) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      } else if (head >= 0xfdU) {
        validateBufferLength(1 + 8, length, true);
        byteSize = 1 + 8 + readIntegerNonEmpty<ValueLength>(ptr + 1, 8);
        if (byteSize == 1 + 8) {
          throw Exception(Exception::ValidatorInvalidLength,
                          "Invalid size for Custom type");
        }
      }

      validateSliceLength(ptr, byteSize, isSubPart);
      break;
    }
  }

  // common validation that must happen for all types
  validateSliceLength(ptr, length, isSubPart);
}